

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O3

void __thiscall Executor::visit(Executor *this,FunctionDeclarationNode *node)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TypeName TVar3;
  pointer pcVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  RuntimeFunctionSymbol *pRVar7;
  _Node *p_Var8;
  pointer *__ptr;
  _List_node_base *p_Var9;
  ArgumentsList *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  string name;
  _Head_base<0UL,_RuntimeFunctionSymbol_*,_false> local_98;
  string local_90;
  Executor *local_70;
  shared_ptr<RuntimeSymbol> local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>
  local_58;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  pcVar4 = (node->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar4,pcVar4 + (node->name_)._M_string_length);
  TVar3 = node->returnType_;
  pRVar7 = (RuntimeFunctionSymbol *)operator_new(0x58);
  peVar5 = (node->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var6 = (node->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  (pRVar7->super_RuntimeSymbol)._vptr_RuntimeSymbol =
       (_func_int **)&PTR__RuntimeFunctionSymbol_00150220;
  (pRVar7->name_)._M_dataplus._M_p = (pointer)&(pRVar7->name_).field_2;
  local_70 = this;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pRVar7->name_,local_90._M_dataplus._M_p,
             local_90._M_dataplus._M_p + local_90._M_string_length);
  pRVar7->returnType_ = TVar3;
  this_00 = &pRVar7->arguments_;
  (pRVar7->arguments_).
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (pRVar7->arguments_).
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (pRVar7->arguments_).
  super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ._M_impl._M_node._M_size = 0;
  (pRVar7->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (pRVar7->body_).super___shared_ptr<BlockNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var6;
  p_Var9 = (node->arguments_).
           super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  local_98._M_head_impl = pRVar7;
  if (p_Var9 != (_List_node_base *)&node->arguments_) {
    paVar2 = &local_58.first.field_2;
    do {
      local_58.first._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,p_Var9[1]._M_next,
                 (long)&(p_Var9[1]._M_prev)->_M_next + (long)p_Var9[1]._M_next);
      local_58.second = *(TypeName *)&p_Var9[3]._M_next;
      p_Var8 = std::__cxx11::
               list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>
               ::_M_create_node<std::pair<std::__cxx11::string,TypeName>const&>
                         ((list<std::pair<std::__cxx11::string,TypeName>,std::allocator<std::pair<std::__cxx11::string,TypeName>>>
                           *)this_00,&local_58);
      std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
      psVar1 = &(pRVar7->arguments_).
                super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != paVar2) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
      p_Var9 = p_Var9->_M_next;
    } while (p_Var9 != (_List_node_base *)&node->arguments_);
  }
  std::__shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<RuntimeFunctionSymbol,std::default_delete<RuntimeFunctionSymbol>,void>
            ((__shared_ptr<RuntimeSymbol,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (unique_ptr<RuntimeFunctionSymbol,_std::default_delete<RuntimeFunctionSymbol>_> *)
             &local_98);
  Context::addSymbol(&local_70->context_,&local_90,&local_68);
  if (local_68.super___shared_ptr<RuntimeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<RuntimeSymbol,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_98._M_head_impl != (RuntimeFunctionSymbol *)0x0) {
    (*((local_98._M_head_impl)->super_RuntimeSymbol)._vptr_RuntimeSymbol[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Executor::visit(const FunctionDeclarationNode& node)
{
  const auto name = node.getName();
  const auto type = node.getReturnType();
  auto symbol = std::make_unique<RuntimeFunctionSymbol>(name, type, node.getBody());
  for(const auto& arg : node.getArguments())
  {
    symbol->addArgument(RuntimeFunctionSymbol::Argument{arg.first, arg.second});
  }

  context_.addSymbol(name, std::move(symbol));
}